

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transformer.cpp
# Opt level: O0

variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>
* __thiscall
verilogAST::Transformer::visit
          (variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>
           *__return_storage_ptr__,Transformer *this,
          variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>
          *node)

{
  anon_class_8_1_8991fb9c local_28;
  variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>
  *local_20;
  variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>
  *node_local;
  Transformer *this_local;
  
  local_28.this = this;
  local_20 = node;
  node_local = (variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>
                *)this;
  this_local = (Transformer *)__return_storage_ptr__;
  std::
  visit<verilogAST::Transformer::visit(std::variant<std::unique_ptr<verilogAST::Identifier,std::default_delete<verilogAST::Identifier>>,std::unique_ptr<verilogAST::Vector,std::default_delete<verilogAST::Vector>>>)::__0,std::variant<std::unique_ptr<verilogAST::Identifier,std::default_delete<verilogAST::Identifier>>,std::unique_ptr<verilogAST::Vector,std::default_delete<verilogAST::Vector>>>&>
            (__return_storage_ptr__,&local_28,node);
  return __return_storage_ptr__;
}

Assistant:

std::variant<std::unique_ptr<Identifier>, std::unique_ptr<Vector>>
Transformer::visit(
    std::variant<std::unique_ptr<Identifier>, std::unique_ptr<Vector>> node) {
  return std::visit(
      [&](auto&& value) -> std::variant<std::unique_ptr<Identifier>,
                                        std::unique_ptr<Vector>> {
        if (auto ptr = dynamic_cast<Identifier*>(value.get())) {
          value.release();
          return this->visit(std::unique_ptr<Identifier>(ptr));
        }
        if (auto ptr = dynamic_cast<Vector*>(value.get())) {
          value.release();
          return this->visit(std::unique_ptr<Vector>(ptr));
        }
        throw std::runtime_error("Unreachable");  // LCOV_EXCL_LINE
        return std::move(value);                  // LCOV_EXCL_LINE
      },
      node);
}